

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientMonitor.cpp
# Opt level: O0

void __thiscall ClientMonitor::notifyRead(ClientMonitor *this,TCPSocket *socket)

{
  mapped_type *ppCVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  TCPSocket *socket_local;
  ClientMonitor *this_local;
  
  lock._M_device = (mutex_type *)socket;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->clientListAccess);
  ppCVar1 = std::
            unordered_map<TCPSocket,_Client_*,_std::hash<TCPSocket>,_std::equal_to<TCPSocket>,_std::allocator<std::pair<const_TCPSocket,_Client_*>_>_>
            ::operator[](&this->socketToClientMap,(key_type *)lock._M_device);
  (**((*ppCVar1)->super_IONotifiable)._vptr_IONotifiable)();
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void ClientMonitor::notifyRead(TCPSocket & socket) {
    std::lock_guard<std::mutex> lock(clientListAccess);
    socketToClientMap[socket]->notifyRead();
}